

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscriber.cpp
# Opt level: O1

string * __thiscall
miniros::Subscriber::getTopic_abi_cxx11_(string *__return_storage_ptr__,Subscriber *this)

{
  element_type *peVar1;
  pointer pcVar2;
  
  peVar1 = (this->impl_).super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (peVar1 == (element_type *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar2 = (peVar1->topic_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (peVar1->topic_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Subscriber::getTopic() const
  {
    if (impl_)
      {
	return impl_->topic_;
      }

    return std::string();
  }